

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
AdapterPromiseNode<kj::Rc<kj::Refcounted>,_kj::_::PromiseAndFulfillerAdapter<kj::Rc<kj::Refcounted>_>_>
::fulfill(AdapterPromiseNode<kj::Rc<kj::Refcounted>,_kj::_::PromiseAndFulfillerAdapter<kj::Rc<kj::Refcounted>_>_>
          *this,Rc<kj::Refcounted> *value)

{
  Rc<kj::Refcounted> *value_00;
  ExceptionOr<kj::Rc<kj::Refcounted>_> local_1c8;
  Rc<kj::Refcounted> *local_18;
  Rc<kj::Refcounted> *value_local;
  AdapterPromiseNode<kj::Rc<kj::Refcounted>,_kj::_::PromiseAndFulfillerAdapter<kj::Rc<kj::Refcounted>_>_>
  *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = value;
    value_local = (Rc<kj::Refcounted> *)this;
    value_00 = mv<kj::Rc<kj::Refcounted>>(value);
    ExceptionOr<kj::Rc<kj::Refcounted>_>::ExceptionOr(&local_1c8,value_00);
    ExceptionOr<kj::Rc<kj::Refcounted>_>::operator=(&this->result,&local_1c8);
    ExceptionOr<kj::Rc<kj::Refcounted>_>::~ExceptionOr(&local_1c8);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }